

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextbookBoyerMoore.cpp
# Opt level: O3

bool __thiscall
UnifiedRegex::TextbookBoyerMoore<char16_t>::Match<4u,1u>
          (TextbookBoyerMoore<char16_t> *this,Char *input,CharCount inputLength,
          CharCount *inputOffset,Char *pat,CharCount patLen,RegexStats *stats)

{
  code *pcVar1;
  bool bVar2;
  Char CVar3;
  BOOL BVar4;
  int iVar5;
  undefined4 *puVar6;
  int iVar7;
  Type *pTVar8;
  CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1> *pCVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  Type local_b4;
  ulong uStack_b0;
  int lastOcc_1;
  undefined4 *local_a8;
  ulong local_a0;
  long local_98;
  ulong local_90;
  ulong local_88;
  int *local_80;
  ulong local_78;
  CharCount *local_70;
  uint local_68;
  uint local_64;
  TextbookBoyerMoore<char16_t> *local_60;
  Char *local_58;
  CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1> *local_50;
  int local_44;
  Char *pCStack_40;
  int lastOcc;
  ulong local_38;
  
  local_60 = this;
  pCStack_40 = input;
  if (input == (Char *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/TextbookBoyerMoore.cpp"
                       ,0xb9,"(input != 0)","input != 0");
    if (!bVar2) goto LAB_00f06c6f;
    *puVar6 = 0;
  }
  if (inputLength < *inputOffset) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/TextbookBoyerMoore.cpp"
                       ,0xba,"(inputOffset <= inputLength)","inputOffset <= inputLength");
    if (!bVar2) {
LAB_00f06c6f:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  if (patLen <= inputLength) {
    local_38 = (ulong)*inputOffset;
    uVar10 = patLen - 1;
    if (*inputOffset < inputLength - uVar10) {
      local_80 = (local_60->goodSuffix).ptr;
      local_50 = &local_60->lastOccurrence;
      uStack_b0 = (ulong)uVar10;
      local_70 = inputOffset;
      local_a8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      local_a0 = (ulong)(patLen - 2);
      local_98 = local_a0 << 0x20;
      local_68 = patLen * 4 - 8;
      uVar12 = (ulong)uVar10;
      uVar14 = (ulong)(uVar10 * 4);
      uVar10 = inputLength - uVar10;
      local_78 = (ulong)patLen;
      local_58 = pat;
      do {
        iVar5 = (int)uVar12;
        CVar3 = pCStack_40[(uint)((int)local_38 + iVar5)];
        pCVar9 = local_50;
        if (pat[uVar14] != CVar3) {
          do {
            if ((ushort)CVar3 < 0x100) {
              BVar4 = CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::IsInDirectMap
                                (pCVar9,(uint)(ushort)CVar3);
              if (BVar4 == 0) {
                uVar11 = (int)local_38 + (int)local_78;
                pat = local_58;
              }
              else {
                local_44 = CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::GetDirectMap
                                     (pCVar9,(uint)(ushort)CVar3);
                pat = local_58;
LAB_00f06a3e:
                iVar7 = iVar5 - local_44;
                if (iVar7 < local_80[uStack_b0]) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  puVar6 = local_a8;
                  *local_a8 = 1;
                  bVar2 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/TextbookBoyerMoore.cpp"
                                     ,0xeb,
                                     "((int)lastPatCharIndex - lastOcc >= localGoodSuffix[lastPatCharIndex])"
                                     ,
                                     "(int)lastPatCharIndex - lastOcc >= localGoodSuffix[lastPatCharIndex]"
                                    );
                  if (!bVar2) goto LAB_00f06c6f;
                  *puVar6 = 0;
                  iVar7 = iVar5 - local_44;
                }
                uVar11 = iVar7 + (CharCount)local_38;
                pCVar9 = local_50;
              }
            }
            else {
              bVar2 = CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::GetNonDirect
                                (pCVar9,(uint)(ushort)CVar3,&local_44);
              if (bVar2) goto LAB_00f06a3e;
              uVar11 = (int)local_38 + (int)local_78;
              pCVar9 = local_50;
            }
            if (uVar10 <= uVar11) {
              return false;
            }
            local_38 = (ulong)uVar11;
            CVar3 = pCStack_40[uVar11 + iVar5];
          } while (pat[uVar14] != CVar3);
        }
        pCVar9 = local_50;
        uVar13 = local_a0;
        lVar15 = local_98;
        uVar11 = local_68;
        if (iVar5 == 0) {
          *local_70 = (CharCount)local_38;
          return true;
        }
        while( true ) {
          if (stats != (RegexStats *)0x0) {
            stats->numCompares = stats->numCompares + 1;
          }
          CVar3 = pCStack_40[(CharCount)local_38 + (int)uVar13];
          if ((((pat[uVar11] != CVar3) && (pat[uVar11 + 1] != CVar3)) && (pat[uVar11 + 2] != CVar3))
             && (pat[uVar11 + 3] != CVar3)) break;
          uVar13 = uVar13 - 1;
          lVar15 = lVar15 + -0x100000000;
          uVar11 = uVar11 - 4;
          if ((int)uVar13 < 0) {
            *local_70 = (CharCount)local_38;
            return true;
          }
        }
        uVar11 = (uint)(ushort)CVar3;
        local_90 = uVar12;
        local_88 = uVar14;
        local_64 = uVar10;
        if (uVar11 < 0x100) {
          BVar4 = CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::IsInDirectMap
                            (local_50,uVar11);
          if (BVar4 == 0) {
            iVar5 = (local_60->lastOccurrence).defv;
            pat = local_58;
          }
          else {
            iVar5 = CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::GetDirectMap
                              (pCVar9,uVar11);
            pat = local_58;
          }
        }
        else {
          bVar2 = CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::GetNonDirect
                            (local_50,uVar11,&local_b4);
          pTVar8 = &(local_60->lastOccurrence).defv;
          if (bVar2) {
            pTVar8 = &local_b4;
          }
          iVar5 = *pTVar8;
        }
        iVar5 = (int)uVar13 - iVar5;
        iVar7 = *(int *)((long)local_80 + (lVar15 >> 0x1e));
        if (iVar5 <= iVar7) {
          iVar5 = iVar7;
        }
        uVar11 = iVar5 + (CharCount)local_38;
        local_38 = (ulong)uVar11;
        uVar12 = local_90;
        uVar14 = local_88;
        uVar10 = local_64;
        if (local_64 <= uVar11) {
          return false;
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

bool TextbookBoyerMoore<C>::Match
        ( const Char *const input
        , const CharCount inputLength
        , CharCount& inputOffset
        , const Char* pat
        , const CharCount patLen
#if ENABLE_REGEX_CONFIG_OPTIONS
        , RegexStats* stats
#endif
        ) const
    {

        Assert(input != 0);
        Assert(inputOffset <= inputLength);

        if (inputLength < patLen)
            return false;

        CharCount offset = inputOffset;

        const CharCount endOffset = inputLength - (patLen - 1);
        const int32* const localGoodSuffix = goodSuffix;
        const LastOccMap* const localLastOccurrence = &lastOccurrence;

        const CharCount lastPatCharIndex = (patLen - 1);

        while (offset < endOffset)
        {
            // A separate tight loop to find the last character
            while (true)
            {
                uint inputChar = Chars<Char>::CTU(input[offset + lastPatCharIndex]);
                if (MatchPatternAt<equivClassSize, lastPatCharEquivClass>(inputChar, pat, lastPatCharIndex))
                {
                    // Found a match. Break out of this loop and go to the match pattern loop
                    break;
                }
                // Negative case is more common,
                // Write the checks so that we have a super tight loop
                int lastOcc;
                if (inputChar < localLastOccurrence->GetDirectMapSize())
                {
                    if (!localLastOccurrence->IsInDirectMap(inputChar))
                    {
                        offset += patLen;
                        if (offset >= endOffset)
                        {
                            return false;
                        }
                        continue;
                    }
                    lastOcc = localLastOccurrence->GetDirectMap(inputChar);
                }
                else if (!localLastOccurrence->GetNonDirect(inputChar, lastOcc))
                {
                    offset += patLen;
                    if (offset >= endOffset)
                    {
                        return false;
                    }
                    continue;
                }
                Assert((int)lastPatCharIndex - lastOcc >= localGoodSuffix[lastPatCharIndex]);
                offset += lastPatCharIndex - lastOcc;
                if (offset >= endOffset)
                {
                    return false;
                }
            }

            // CONSIDER: we can remove this check if we stop using TextbookBoyerMoore for one char pattern
            if (lastPatCharIndex == 0)
            {
                inputOffset = offset;
                return true;
            }

            // Match the rest of the pattern
            int32 j = lastPatCharIndex - 1;
            while (true)
            {
#if ENABLE_REGEX_CONFIG_OPTIONS
                if (stats != 0)
                    stats->numCompares++;
#endif
                uint inputChar = Chars<Char>::CTU(input[offset + j]);
                if (!MatchPatternAt<equivClassSize, equivClassSize>(inputChar, pat, j))
                {
                    const int32 e = j - localLastOccurrence->Get((Char)inputChar);
                    offset += e > localGoodSuffix[j] ? e : localGoodSuffix[j];
                    break;
                }
                if (--j < 0)
                {
                    inputOffset = offset;
                    return true;
                }
            }
        }
        return false;
    }